

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O3

string * __thiscall
absl::lts_20250127::(anonymous_namespace)::CEscapeInternal_abi_cxx11_
          (string *__return_storage_ptr__,void *this,string_view src,bool use_hex,bool utf8_safe)

{
  byte bVar1;
  string *psVar2;
  bool bVar3;
  char cVar4;
  void *pvVar5;
  char local_40;
  
  psVar2 = (string *)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (void *)0x0) {
    pvVar5 = (void *)0x0;
    bVar3 = false;
    do {
      bVar1 = *(byte *)(src._M_len + (long)pvVar5);
      if (bVar1 < 0x22) {
        if (((bVar1 != 9) && (bVar1 != 10)) && (bVar1 != 0xd)) goto LAB_003276ba;
LAB_00327749:
        psVar2 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00327751:
        bVar3 = false;
      }
      else {
        if (((bVar1 == 0x22) || (bVar1 == 0x27)) || (bVar1 == 0x5c)) goto LAB_00327749;
LAB_003276ba:
        cVar4 = (char)__return_storage_ptr__;
        if ((use_hex && (char)bVar1 < '\0') ||
           (((byte)(bVar1 - 0x20) < 0x5f &&
            ((!bVar3 || (-1 < (char)(&ascii_internal::kPropertyBits)[bVar1])))))) {
LAB_003277b4:
          psVar2 = (string *)std::__cxx11::string::push_back(cVar4);
          goto LAB_00327751;
        }
        local_40 = (char)src._M_str;
        if (local_40 == '\0') {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::push_back(cVar4);
          std::__cxx11::string::push_back(cVar4);
          goto LAB_003277b4;
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::push_back(cVar4);
        bVar3 = true;
        psVar2 = (string *)std::__cxx11::string::push_back(cVar4);
      }
      pvVar5 = (void *)((long)pvVar5 + 1);
    } while (this != pvVar5);
  }
  return psVar2;
}

Assistant:

std::string CEscapeInternal(absl::string_view src, bool use_hex,
                            bool utf8_safe) {
  std::string dest;
  bool last_hex_escape = false;  // true if last output char was \xNN.

  for (char c : src) {
    bool is_hex_escape = false;
    switch (c) {
      case '\n': dest.append("\\" "n"); break;
      case '\r': dest.append("\\" "r"); break;
      case '\t': dest.append("\\" "t"); break;
      case '\"': dest.append("\\" "\""); break;
      case '\'': dest.append("\\" "'"); break;
      case '\\': dest.append("\\" "\\"); break;
      default: {
        // Note that if we emit \xNN and the src character after that is a hex
        // digit then that digit must be escaped too to prevent it being
        // interpreted as part of the character code by C.
        const unsigned char uc = static_cast<unsigned char>(c);
        if ((!utf8_safe || uc < 0x80) &&
            (!absl::ascii_isprint(uc) ||
             (last_hex_escape && absl::ascii_isxdigit(uc)))) {
          if (use_hex) {
            dest.append("\\" "x");
            dest.push_back(numbers_internal::kHexChar[uc / 16]);
            dest.push_back(numbers_internal::kHexChar[uc % 16]);
            is_hex_escape = true;
          } else {
            dest.append("\\");
            dest.push_back(numbers_internal::kHexChar[uc / 64]);
            dest.push_back(numbers_internal::kHexChar[(uc % 64) / 8]);
            dest.push_back(numbers_internal::kHexChar[uc % 8]);
          }
        } else {
          dest.push_back(c);
          break;
        }
      }
    }
    last_hex_escape = is_hex_escape;
  }

  return dest;
}